

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

ErrorOr<llvm::sys::fs::perms> *
llvm::sys::fs::getPermissions(ErrorOr<llvm::sys::fs::perms> *__return_storage_ptr__,Twine *Path)

{
  int StatRet;
  StringRef SVar1;
  error_code eVar2;
  file_status Status;
  SmallString<128U> PathStorage;
  stat Status_1;
  file_status local_198;
  SmallVectorImpl<char> local_150;
  undefined1 local_140 [128];
  stat local_c0;
  
  local_198.super_basic_file_status.fs_st_size._0_4_ = 0;
  local_198.super_basic_file_status._36_8_ = 0;
  local_198.super_basic_file_status.fs_st_atime_nsec = 0;
  local_198.super_basic_file_status.fs_st_mtime_nsec = 0;
  local_198.super_basic_file_status.fs_st_uid = 0;
  local_198.super_basic_file_status.fs_st_gid = 0;
  local_198.super_basic_file_status.fs_st_atime = 0;
  local_198.super_basic_file_status.fs_st_mtime = 0;
  local_198.super_basic_file_status.Perms = perms_not_known;
  local_198.fs_st_dev = 0;
  local_198.fs_st_nlinks = 0;
  local_198.fs_st_ino = 0;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_150.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_140;
  SVar1 = Twine::toNullTerminatedStringRef(Path,&local_150);
  StatRet = stat(SVar1.Data,(stat *)&local_c0);
  eVar2 = fillStatus(StatRet,&local_c0,&local_198);
  if ((undefined1 *)
      local_150.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_140) {
    free(local_150.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  if (eVar2._M_value == 0) {
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
    *(perms *)(__return_storage_ptr__->field_0).TStorage.super_AlignedCharArray<4UL,_4UL>.buffer =
         local_198.super_basic_file_status.Perms;
  }
  else {
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)(__return_storage_ptr__->field_0).TStorage.super_AlignedCharArray<4UL,_4UL>.buffer =
         eVar2._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar2._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<perms> getPermissions(const Twine &Path) {
  file_status Status;
  if (std::error_code EC = status(Path, Status))
    return EC;

  return Status.permissions();
}